

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_astar.hpp
# Opt level: O2

vector<Tiles::State,_std::allocator<Tiles::State>_> * __thiscall
external_astar::ExternalAstar<Tiles>::search
          (vector<Tiles::State,_std::allocator<Tiles::State>_> *__return_storage_ptr__,
          ExternalAstar<Tiles> *this,State *init)

{
  ExternalAstarOpenList<Node<Tiles>_> *this_00;
  vector<Tiles::State,_std::allocator<Tiles::State>_> *this_01;
  size_t *psVar1;
  int newb;
  Tiles *this_02;
  ulong uVar2;
  long lVar3;
  long lVar4;
  State state;
  Node<Tiles> n;
  Node<Tiles> parent;
  char local_50;
  int local_4c;
  State parent_state;
  
  this_00 = &this->open;
  wrap(&parent,this,init,(Node<Tiles> *)0x0,0,-1);
  ExternalAstarOpenList<Node<Tiles>_>::push(this_00,&parent);
  this_01 = &this->path;
  while( true ) {
    if ((this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        (this->path).super__Vector_base<Tiles::State,_std::allocator<Tiles::State>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_0010b426;
    ExternalAstarOpenList<Node<Tiles>_>::pop(&n,this_00);
    Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&state,n.packed);
    if (state.h == '\0') break;
    psVar1 = &(this->super_SearchAlg<Tiles>).expd;
    *psVar1 = *psVar1 + 1;
    uVar2 = (ulong)(byte)state.blank;
    lVar4 = 0;
    while( true ) {
      this_02 = (this->super_SearchAlg<Tiles>).dom;
      lVar3 = (long)(char)uVar2 * 0x14;
      if (*(int *)(this_02 + lVar3 + 0x4440) <= lVar4) break;
      newb = *(int *)(this_02 + lVar4 * 4 + lVar3 + 0x4444);
      if (newb != n.pop) {
        psVar1 = &(this->super_SearchAlg<Tiles>).gend;
        *psVar1 = *psVar1 + 1;
        Tiles::apply((Edge<Tiles> *)&parent,this_02,&state,newb);
        wrap((Node<Tiles> *)&parent_state,this,&state,&n,(int)parent.parent_packed.word,parent._4_4_
            );
        ExternalAstarOpenList<Node<Tiles>_>::push(this_00,(Node<Tiles> *)&parent_state);
        state.h = local_50;
        uVar2 = (ulong)local_4c;
        state.tiles[state.blank] = state.tiles[uVar2];
        state.blank = (char)local_4c;
      }
      lVar4 = lVar4 + 1;
    }
  }
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back(this_01,&state);
  while (n.packed.word != n.parent_packed.word) {
    ExternalAstarOpenList<Node<Tiles>_>::trace_parent(&parent,this_00,&n);
    Tiles::unpack((this->super_SearchAlg<Tiles>).dom,&parent_state,parent.packed);
    std::vector<Tiles::State,_std::allocator<Tiles::State>_>::push_back(this_01,&parent_state);
    n.parent_packed.word = CONCAT44(parent.parent_packed.word._4_4_,(int)parent.parent_packed.word);
    n.packed = (PackedState)parent.packed.word;
  }
  ExternalAstarOpenList<Node<Tiles>_>::clear(this_00);
LAB_0010b426:
  std::vector<Tiles::State,_std::allocator<Tiles::State>_>::vector(__return_storage_ptr__,this_01);
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename D::State> search(typename D::State &init) {
            open.push(wrap(init, nullptr, 0, -1));

            while (path.size() == 0) {
                try {
                    Node<D> n = open.pop();

                    typename D::State state;
                    this->dom.unpack(state, n.packed);

                    if (this->dom.isgoal(state)) {
                        // trace path here
                        path.push_back(state);
                        while(n.packed != n.parent_packed) {
                            Node<D> parent = open.trace_parent(n);
                            typename D::State parent_state;
                            this->dom.unpack(parent_state, parent.packed);
                            path.push_back(parent_state);
                            n = parent;
                        }
                        open.clear();
                        break;
                    }
                    this->expd++;
                    for (int i = 0; i < this->dom.nops(state); i++) {
                        int op = this->dom.nthop(state, i);
                        if (op == n.pop)
                            continue;
                        this->gend++;
                        Edge<D> e = this->dom.apply(state, op);
                        open.push(wrap(state, &n, e.cost, e.pop));
                        this->dom.undo(state, e);
                    }
                } catch (OpenListEmpty& e) {
                    break;
                } catch (...) {
                    throw;
                }
            }
            return path;
        }